

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_file_block_manager.cpp
# Opt level: O3

MainHeader * duckdb::MainHeader::Read(MainHeader *__return_storage_ptr__,ReadStream *source)

{
  _Alloc_hider params;
  long *plVar1;
  IOException *pIVar2;
  size_type *psVar3;
  idx_t version_number;
  _Alloc_hider _Var4;
  idx_t i;
  long lVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  unsigned_long value;
  data_t magic_bytes [4];
  string version_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  string local_d8;
  int local_b4;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_70 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (**source->_vptr_ReadStream)(source,&local_b4,4);
  if (local_b4 != 0x4b435544) {
    pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"The file is not a valid DuckDB database file!","");
    IOException::IOException(pIVar2,&local_d8);
    __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
  }
  (**source->_vptr_ReadStream)(source,&local_d8,8);
  params._M_p = local_d8._M_dataplus._M_p;
  __return_storage_ptr__->version_number = (uint64_t)local_d8._M_dataplus._M_p;
  if ((duckdb *)0xfffffffffffffffc < (duckdb *)(local_d8._M_dataplus._M_p + -0x43)) {
    lVar5 = 0;
    do {
      (**source->_vptr_ReadStream)(source,&local_d8,8);
      __return_storage_ptr__->flags[lVar5] = (uint64_t)local_d8._M_dataplus._M_p;
      lVar5 = lVar5 + 1;
    } while (lVar5 != 4);
    __return_storage_ptr__->library_git_desc[0x10] = '\0';
    __return_storage_ptr__->library_git_desc[0x11] = '\0';
    __return_storage_ptr__->library_git_desc[0x12] = '\0';
    __return_storage_ptr__->library_git_desc[0x13] = '\0';
    __return_storage_ptr__->library_git_desc[0x14] = '\0';
    __return_storage_ptr__->library_git_desc[0x15] = '\0';
    __return_storage_ptr__->library_git_desc[0x16] = '\0';
    __return_storage_ptr__->library_git_desc[0x17] = '\0';
    __return_storage_ptr__->library_git_desc[0x18] = '\0';
    __return_storage_ptr__->library_git_desc[0x19] = '\0';
    __return_storage_ptr__->library_git_desc[0x1a] = '\0';
    __return_storage_ptr__->library_git_desc[0x1b] = '\0';
    __return_storage_ptr__->library_git_desc[0x1c] = '\0';
    __return_storage_ptr__->library_git_desc[0x1d] = '\0';
    __return_storage_ptr__->library_git_desc[0x1e] = '\0';
    __return_storage_ptr__->library_git_desc[0x1f] = '\0';
    __return_storage_ptr__->library_git_desc[0] = '\0';
    __return_storage_ptr__->library_git_desc[1] = '\0';
    __return_storage_ptr__->library_git_desc[2] = '\0';
    __return_storage_ptr__->library_git_desc[3] = '\0';
    __return_storage_ptr__->library_git_desc[4] = '\0';
    __return_storage_ptr__->library_git_desc[5] = '\0';
    __return_storage_ptr__->library_git_desc[6] = '\0';
    __return_storage_ptr__->library_git_desc[7] = '\0';
    __return_storage_ptr__->library_git_desc[8] = '\0';
    __return_storage_ptr__->library_git_desc[9] = '\0';
    __return_storage_ptr__->library_git_desc[10] = '\0';
    __return_storage_ptr__->library_git_desc[0xb] = '\0';
    __return_storage_ptr__->library_git_desc[0xc] = '\0';
    __return_storage_ptr__->library_git_desc[0xd] = '\0';
    __return_storage_ptr__->library_git_desc[0xe] = '\0';
    __return_storage_ptr__->library_git_desc[0xf] = '\0';
    (**source->_vptr_ReadStream)(source,__return_storage_ptr__->library_git_desc,0x20);
    __return_storage_ptr__->library_git_hash[0x10] = '\0';
    __return_storage_ptr__->library_git_hash[0x11] = '\0';
    __return_storage_ptr__->library_git_hash[0x12] = '\0';
    __return_storage_ptr__->library_git_hash[0x13] = '\0';
    __return_storage_ptr__->library_git_hash[0x14] = '\0';
    __return_storage_ptr__->library_git_hash[0x15] = '\0';
    __return_storage_ptr__->library_git_hash[0x16] = '\0';
    __return_storage_ptr__->library_git_hash[0x17] = '\0';
    __return_storage_ptr__->library_git_hash[0x18] = '\0';
    __return_storage_ptr__->library_git_hash[0x19] = '\0';
    __return_storage_ptr__->library_git_hash[0x1a] = '\0';
    __return_storage_ptr__->library_git_hash[0x1b] = '\0';
    __return_storage_ptr__->library_git_hash[0x1c] = '\0';
    __return_storage_ptr__->library_git_hash[0x1d] = '\0';
    __return_storage_ptr__->library_git_hash[0x1e] = '\0';
    __return_storage_ptr__->library_git_hash[0x1f] = '\0';
    __return_storage_ptr__->library_git_hash[0] = '\0';
    __return_storage_ptr__->library_git_hash[1] = '\0';
    __return_storage_ptr__->library_git_hash[2] = '\0';
    __return_storage_ptr__->library_git_hash[3] = '\0';
    __return_storage_ptr__->library_git_hash[4] = '\0';
    __return_storage_ptr__->library_git_hash[5] = '\0';
    __return_storage_ptr__->library_git_hash[6] = '\0';
    __return_storage_ptr__->library_git_hash[7] = '\0';
    __return_storage_ptr__->library_git_hash[8] = '\0';
    __return_storage_ptr__->library_git_hash[9] = '\0';
    __return_storage_ptr__->library_git_hash[10] = '\0';
    __return_storage_ptr__->library_git_hash[0xb] = '\0';
    __return_storage_ptr__->library_git_hash[0xc] = '\0';
    __return_storage_ptr__->library_git_hash[0xd] = '\0';
    __return_storage_ptr__->library_git_hash[0xe] = '\0';
    __return_storage_ptr__->library_git_hash[0xf] = '\0';
    (**source->_vptr_ReadStream)(source,__return_storage_ptr__->library_git_hash,0x20);
    return __return_storage_ptr__;
  }
  GetDuckDBVersion_abi_cxx11_
            ((string *)&local_d8,(duckdb *)local_d8._M_dataplus._M_p,version_number);
  local_b0 = local_a0;
  local_a8 = 0;
  local_a0[0] = 0;
  if (local_d8._M_string_length == 0) {
    paVar6 = &local_60;
    local_70[0] = paVar6;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"an ","");
    plVar1 = (long *)::std::__cxx11::string::append((char *)local_70);
    local_118._M_dataplus._M_p = (pointer)*plVar1;
    psVar3 = (size_type *)(plVar1 + 2);
    if ((size_type *)local_118._M_dataplus._M_p == psVar3) {
      local_118.field_2._M_allocated_capacity = *psVar3;
      local_118.field_2._8_4_ = (undefined4)plVar1[3];
      local_118.field_2._12_4_ = *(undefined4 *)((long)plVar1 + 0x1c);
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar3;
    }
    local_118._M_string_length = plVar1[1];
    *plVar1 = (long)psVar3;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90," version of DuckDB","");
    ::std::operator+(&local_f8,&local_118,&local_90);
    ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_f8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    _Var4._M_p = (pointer)local_70[0];
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
      _Var4._M_p = (pointer)local_70[0];
    }
  }
  else {
    paVar6 = &local_118.field_2;
    local_118._M_dataplus._M_p = (pointer)paVar6;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_118,local_d8._M_dataplus._M_p,
               (duckdb *)(local_d8._M_dataplus._M_p + local_d8._M_string_length));
    ::std::operator+(&local_f8,"DuckDB version ",&local_118);
    ::std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_f8);
    _Var4._M_p = local_118._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
      _Var4._M_p = local_118._M_dataplus._M_p;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var4._M_p != paVar6) {
    operator_delete(_Var4._M_p);
  }
  pIVar2 = (IOException *)__cxa_allocate_exception(0x10);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f8,
             "Trying to read a database file with version number %lld, but we can only read versions between %lld and %lld.\nThe database file was created with %s.\n\nNewer DuckDB version might introduce backward incompatible changes (possibly guarded by compatibility settings)See the storage page for migration strategy and more information: https://duckdb.org/internals/storage"
             ,"");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char*>((string *)&local_50,local_b0,local_b0 + local_a8);
  IOException::IOException<unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string>
            (pIVar2,&local_f8,(unsigned_long)params._M_p,0x40,0x42,&local_50);
  __cxa_throw(pIVar2,&IOException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

MainHeader MainHeader::Read(ReadStream &source) {
	data_t magic_bytes[MAGIC_BYTE_SIZE];
	MainHeader header;
	source.ReadData(magic_bytes, MainHeader::MAGIC_BYTE_SIZE);
	if (memcmp(magic_bytes, MainHeader::MAGIC_BYTES, MainHeader::MAGIC_BYTE_SIZE) != 0) {
		throw IOException("The file is not a valid DuckDB database file!");
	}
	header.version_number = source.Read<uint64_t>();
	// check the version number
	if (header.version_number < VERSION_NUMBER_LOWER || header.version_number > VERSION_NUMBER_UPPER) {
		auto version = GetDuckDBVersion(header.version_number);
		string version_text;
		if (!version.empty()) {
			// known version
			version_text = "DuckDB version " + string(version);
		} else {
			version_text = string("an ") +
			               (VERSION_NUMBER_UPPER > header.version_number ? "older development" : "newer") +
			               string(" version of DuckDB");
		}
		throw IOException(
		    "Trying to read a database file with version number %lld, but we can only read versions between %lld and "
		    "%lld.\n"
		    "The database file was created with %s.\n\n"
		    "Newer DuckDB version might introduce backward incompatible changes (possibly guarded by compatibility "
		    "settings)"
		    "See the storage page for migration strategy and more information: https://duckdb.org/internals/storage",
		    header.version_number, VERSION_NUMBER_LOWER, VERSION_NUMBER_UPPER, version_text);
	}
	// read the flags
	for (idx_t i = 0; i < FLAG_COUNT; i++) {
		header.flags[i] = source.Read<uint64_t>();
	}

	DeserializeVersionNumber(source, header.library_git_desc);
	DeserializeVersionNumber(source, header.library_git_hash);
	return header;
}